

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * wasm::Path::getBinaryenRoot_abi_cxx11_(void)

{
  char *__s;
  allocator<char> *__a;
  string *in_RDI;
  allocator<char> local_12;
  allocator<char> local_11;
  
  __s = getenv("BINARYEN_ROOT");
  if (__s == (char *)0x0) {
    __s = ".";
    __a = &local_11;
  }
  else {
    __a = &local_12;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,__a);
  return in_RDI;
}

Assistant:

std::string getBinaryenRoot() {
  auto* envVar = getenv("BINARYEN_ROOT");
  if (envVar) {
    return envVar;
  }
  return ".";
}